

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

size_t ma_dr_flac__on_read_memory(void *pUserData,void *bufferOut,size_t bytesToRead)

{
  ulong in_RDX;
  void *in_RSI;
  long *in_RDI;
  size_t bytesRemaining;
  ma_dr_flac__memory_stream *memoryStream;
  size_t local_18;
  
  local_18 = in_RDX;
  if ((ulong)(in_RDI[1] - in_RDI[2]) < in_RDX) {
    local_18 = in_RDI[1] - in_RDI[2];
  }
  if (local_18 != 0) {
    memcpy(in_RSI,(void *)(*in_RDI + in_RDI[2]),local_18);
    in_RDI[2] = local_18 + in_RDI[2];
  }
  return local_18;
}

Assistant:

static size_t ma_dr_flac__on_read_memory(void* pUserData, void* bufferOut, size_t bytesToRead)
{
    ma_dr_flac__memory_stream* memoryStream = (ma_dr_flac__memory_stream*)pUserData;
    size_t bytesRemaining;
    MA_DR_FLAC_ASSERT(memoryStream != NULL);
    MA_DR_FLAC_ASSERT(memoryStream->dataSize >= memoryStream->currentReadPos);
    bytesRemaining = memoryStream->dataSize - memoryStream->currentReadPos;
    if (bytesToRead > bytesRemaining) {
        bytesToRead = bytesRemaining;
    }
    if (bytesToRead > 0) {
        MA_DR_FLAC_COPY_MEMORY(bufferOut, memoryStream->data + memoryStream->currentReadPos, bytesToRead);
        memoryStream->currentReadPos += bytesToRead;
    }
    return bytesToRead;
}